

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.cpp
# Opt level: O2

void __thiscall csv::CSVRow::iterator::iterator(iterator *this,CSVRow *_reader,int _i)

{
  undefined1 *puVar1;
  undefined1 auStack_58 [48];
  undefined4 local_28;
  
  this->daddy = _reader;
  (this->field).super___shared_ptr<csv::CSVField,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->field).super___shared_ptr<csv::CSVField,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->i = _i;
  if (_i < (int)_reader->row_length) {
    auStack_58._32_16_ = (undefined1  [16])get_field(_reader,(long)_i);
    auStack_58._16_8_ = SUB108((longdouble)0,0);
    auStack_58._24_2_ = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
    local_28 = 0xffffffff;
    std::make_shared<csv::CSVField,csv::CSVField>((CSVField *)auStack_58);
    std::__shared_ptr<csv::CSVField,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->field).super___shared_ptr<csv::CSVField,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<csv::CSVField,_(__gnu_cxx::_Lock_policy)2> *)auStack_58);
    puVar1 = auStack_58;
  }
  else {
    auStack_58._16_8_ = 0;
    auStack_58._24_2_ = 0;
    auStack_58._26_6_ = 0;
    std::__shared_ptr<csv::CSVField,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->field).super___shared_ptr<csv::CSVField,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<csv::CSVField,_(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 0x10));
    puVar1 = auStack_58 + 0x10;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 8));
  return;
}

Assistant:

CSVRow::iterator::iterator(const CSVRow* _reader, int _i)
        : daddy(_reader), i(_i) {
        if (_i < (int)this->daddy->size())
            this->field = std::make_shared<CSVField>(
                this->daddy->operator[](_i));
        else
            this->field = nullptr;
    }